

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareRepeatedField
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *repeated_field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  bool bVar1;
  LogMessage *pLVar2;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  LogMessageFatal local_50 [23];
  Voidify local_39;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *local_38;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *parent_fields_local;
  FieldDescriptor *repeated_field_local;
  Message *pMStack_20;
  int unpacked_any_local;
  Message *message2_local;
  Message *message1_local;
  MessageDifferencer *this_local;
  
  local_38 = parent_fields;
  parent_fields_local =
       (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        *)repeated_field;
  repeated_field_local._4_4_ = unpacked_any;
  pMStack_20 = message2;
  message2_local = message1;
  message1_local = (Message *)this;
  bVar1 = FieldDescriptor::is_map(repeated_field);
  if (!bVar1) {
    bVar1 = CompareRepeatedRep(this,message2_local,pMStack_20,repeated_field_local._4_4_,
                               (FieldDescriptor *)parent_fields_local,local_38);
    return bVar1;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_60,"!repeated_field->is_map()");
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
             ,0x4c5,local_60._M_len,local_60._M_str);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_50);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar2);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
}

Assistant:

bool MessageDifferencer::CompareRepeatedField(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* repeated_field,
    std::vector<SpecificField>* parent_fields) {
  ABSL_DCHECK(!repeated_field->is_map());
  return CompareRepeatedRep(message1, message2, unpacked_any, repeated_field,
                            parent_fields);
}